

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  uint uVar2;
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar3;
  JOCTET *pJVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  uVar2 = cinfo->Al;
  pjVar3 = cinfo->dest;
  entropy->next_output_byte = pjVar3->next_output_byte;
  entropy->free_in_buffer = pjVar3->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar5 = 0;
    do {
      if (entropy->gather_statistics == 0) {
        iVar7 = (entropy->saved).put_bits;
        uVar8 = (ulong)(((uint)(int)(*MCU_data[lVar5])[0] >> (uVar2 & 0x1f) & 1) != 0) <<
                (0x17U - (char)iVar7 & 0x3f) | (entropy->saved).put_buffer;
        if (iVar7 < 7) {
          iVar7 = iVar7 + 1;
        }
        else {
          iVar6 = iVar7 + 9;
          do {
            iVar7 = iVar6;
            pJVar4 = entropy->next_output_byte;
            entropy->next_output_byte = pJVar4 + 1;
            *pJVar4 = (JOCTET)(uVar8 >> 0x10);
            psVar1 = &entropy->free_in_buffer;
            *psVar1 = *psVar1 - 1;
            if (*psVar1 == 0) {
              dump_buffer_e(entropy);
            }
            if ((~(uint)uVar8 & 0xff0000) == 0) {
              pJVar4 = entropy->next_output_byte;
              entropy->next_output_byte = pJVar4 + 1;
              *pJVar4 = '\0';
              psVar1 = &entropy->free_in_buffer;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) {
                dump_buffer_e(entropy);
              }
            }
            uVar8 = uVar8 << 8;
            iVar6 = iVar7 + -8;
          } while (0xf < iVar6);
          iVar7 = iVar7 + -0x10;
        }
        (entropy->saved).put_buffer = uVar8;
        (entropy->saved).put_bits = iVar7;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < cinfo->blocks_in_MCU);
  }
  pjVar3 = cinfo->dest;
  pjVar3->next_output_byte = entropy->next_output_byte;
  pjVar3->free_in_buffer = entropy->free_in_buffer;
  if (cinfo->restart_interval != 0) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
    }
    entropy->restarts_to_go = entropy->restarts_to_go - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int Al, blkn;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  Al = cinfo->Al;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* We simply emit the Al'th bit of the DC coefficient value. */
    arith_encode(cinfo, st, (MCU_data[blkn][0][0] >> Al) & 1);
  }

  return TRUE;
}